

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtcpcompoundpacket.cpp
# Opt level: O2

void __thiscall jrtplib::RTCPCompoundPacket::~RTCPCompoundPacket(RTCPCompoundPacket *this)

{
  RTPMemoryManager *mgr;
  
  (this->super_RTPMemoryObject)._vptr_RTPMemoryObject =
       (_func_int **)&PTR__RTCPCompoundPacket_001447e8;
  ClearPacketList(this);
  if (((jrtplib *)this->compoundpacket != (jrtplib *)0x0) && (this->deletepacket == true)) {
    RTPDeleteByteArray((jrtplib *)this->compoundpacket,(uint8_t *)(this->super_RTPMemoryObject).mgr,
                       mgr);
  }
  std::__cxx11::_List_base<jrtplib::RTCPPacket_*,_std::allocator<jrtplib::RTCPPacket_*>_>::_M_clear
            (&(this->rtcppacklist).
              super__List_base<jrtplib::RTCPPacket_*,_std::allocator<jrtplib::RTCPPacket_*>_>);
  return;
}

Assistant:

RTCPCompoundPacket::~RTCPCompoundPacket()
{
	ClearPacketList();
	if (compoundpacket && deletepacket)
		RTPDeleteByteArray(compoundpacket,GetMemoryManager());
}